

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

string * testing::internal::JoinAsTuple(string *__return_storage_ptr__,Strings *fields)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar1;
  size_t i;
  ulong uVar2;
  allocator local_29;
  
  __rhs = (fields->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(fields->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__rhs >> 5;
  if (lVar1 == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__rhs);
  }
  else if (lVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
  }
  else {
    std::operator+(__return_storage_ptr__,"(",__rhs);
    for (uVar2 = 1;
        uVar2 < (ulong)((long)(fields->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(fields->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ string JoinAsTuple(const Strings& fields) {
  switch (fields.size()) {
    case 0:
      return "";
    case 1:
      return fields[0];
    default:
      string result = "(" + fields[0];
      for (size_t i = 1; i < fields.size(); i++) {
        result += ", ";
        result += fields[i];
      }
      result += ")";
      return result;
  }
}